

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Set_Charmap(FT_Face face,FT_CharMap charmap)

{
  FT_CharMap *ppFVar1;
  FT_CharMap pFVar2;
  FT_Error FVar3;
  FT_Long FVar4;
  FT_CharMap *ppFVar5;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  ppFVar5 = face->charmaps;
  if (charmap == (FT_CharMap)0x0 || ppFVar5 == (FT_CharMap *)0x0) {
    FVar3 = 0x26;
  }
  else {
    FVar4 = FT_Get_CMap_Format(charmap);
    FVar3 = 6;
    if (FVar4 != 0xe) {
      ppFVar1 = ppFVar5 + face->num_charmaps;
      do {
        if (ppFVar1 <= ppFVar5) {
          return 6;
        }
        pFVar2 = *ppFVar5;
        ppFVar5 = ppFVar5 + 1;
      } while (pFVar2 != charmap);
      face->charmap = pFVar2;
      FVar3 = 0;
    }
  }
  return FVar3;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Charmap( FT_Face     face,
                  FT_CharMap  charmap )
  {
    FT_CharMap*  cur;
    FT_CharMap*  limit;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    cur = face->charmaps;
    if ( !cur || !charmap )
      return FT_THROW( Invalid_CharMap_Handle );

    if ( FT_Get_CMap_Format( charmap ) == 14 )
      return FT_THROW( Invalid_Argument );

    limit = cur + face->num_charmaps;

    for ( ; cur < limit; cur++ )
    {
      if ( cur[0] == charmap )
      {
        face->charmap = cur[0];
        return FT_Err_Ok;
      }
    }

    return FT_THROW( Invalid_Argument );
  }